

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Scroll.cxx
# Opt level: O2

void Fl_Scroll::draw_clip(void *v,int X,int Y,int W,int H)

{
  int iVar1;
  int iVar2;
  Fl_Window *pFVar3;
  Fl_Widget *widget;
  ulong in_RAX;
  Fl_Window *pFVar4;
  Fl_Widget **ppFVar5;
  long lVar6;
  
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2a])();
  if (((ulong)*(byte *)((long)v + 0x6e) < 0x22) &&
     ((0x310133331U >> ((ulong)*(byte *)((long)v + 0x6e) & 0x3f) & 1) != 0)) {
    pFVar3 = *(Fl_Window **)((long)v + 8);
    pFVar4 = Fl_Widget::window((Fl_Widget *)v);
    if (Fl::scheme_bg_ != (Fl_Image *)0x0 && pFVar3 == pFVar4) {
      iVar1 = *(int *)(Fl::scheme_bg_[1]._vptr_Fl_Image + 1);
      iVar2 = *(int *)((long)Fl::scheme_bg_[1]._vptr_Fl_Image + 0xc);
      (*Fl::scheme_bg_->_vptr_Fl_Image[7])
                (Fl::scheme_bg_,(ulong)(uint)(X - X % iVar1),(ulong)(uint)(Y - Y % iVar2),
                 (ulong)(uint)(W + iVar1),(ulong)(uint)(H + iVar2),0,in_RAX & 0xffffffff00000000);
      goto LAB_001c4611;
    }
  }
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
            (fl_graphics_driver,(ulong)*(uint *)((long)v + 100));
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[4])
            (fl_graphics_driver,(ulong)(uint)X,(ulong)(uint)Y,(ulong)(uint)W,H);
LAB_001c4611:
  ppFVar5 = Fl_Group::array((Fl_Group *)v);
  iVar1 = *(int *)((long)v + 0x90);
  for (lVar6 = 0; iVar1 + -2 != (int)lVar6; lVar6 = lVar6 + 1) {
    widget = ppFVar5[lVar6];
    Fl_Group::draw_child((Fl_Group *)v,widget);
    Fl_Group::draw_outside_label((Fl_Group *)v,widget);
  }
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2e])();
  return;
}

Assistant:

void Fl_Scroll::draw_clip(void* v,int X, int Y, int W, int H) {
  fl_push_clip(X,Y,W,H);
  Fl_Scroll* s = (Fl_Scroll*)v;
  // erase background as needed...
  switch (s->box()) {
    case FL_NO_BOX :
    case FL_UP_FRAME :
    case FL_DOWN_FRAME :
    case FL_THIN_UP_FRAME :
    case FL_THIN_DOWN_FRAME :
    case FL_ENGRAVED_FRAME :
    case FL_EMBOSSED_FRAME :
    case FL_BORDER_FRAME :
    case _FL_SHADOW_FRAME :
    case _FL_ROUNDED_FRAME :
    case _FL_OVAL_FRAME :
    case _FL_PLASTIC_UP_FRAME :
    case _FL_PLASTIC_DOWN_FRAME :
        if (s->parent() == (Fl_Group *)s->window() && Fl::scheme_bg_) {
	  Fl::scheme_bg_->draw(X-(X%((Fl_Tiled_Image *)Fl::scheme_bg_)->image()->w()),
	                       Y-(Y%((Fl_Tiled_Image *)Fl::scheme_bg_)->image()->h()),
	                       W+((Fl_Tiled_Image *)Fl::scheme_bg_)->image()->w(),
			       H+((Fl_Tiled_Image *)Fl::scheme_bg_)->image()->h());
	  break;
        }

    default :
	fl_color(s->color());
	fl_rectf(X,Y,W,H);
	break;
  }
  Fl_Widget*const* a = s->array();
  for (int i=s->children()-2; i--;) {
    Fl_Widget& o = **a++;
    s->draw_child(o);
    s->draw_outside_label(o);
  }
  fl_pop_clip();
}